

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall QTableModel::isValid(QTableModel *this,QModelIndex *index)

{
  bool bVar1;
  
  bVar1 = QModelIndex::isValid(index);
  if ((bVar1) && ((long)index->r < (this->verticalHeaderItems).d.size)) {
    bVar1 = (long)index->c < (this->horizontalHeaderItems).d.size;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool QTableModel::isValid(const QModelIndex &index) const
{
    return (index.isValid()
            && index.row() < verticalHeaderItems.size()
            && index.column() < horizontalHeaderItems.size());
}